

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O0

void ht_thread_destroy(HT_Thread *th)

{
  HT_Thread *th_local;
  
  ht_thread_join(th);
  std::thread::~thread(&th->th);
  ht_free(th);
  return;
}

Assistant:

static void
ht_thread_destroy(HT_Thread* th)
{
    ht_thread_join(th);
#ifdef HT_THREAD_IMPL_CPP11
    th->th.~thread();
#elif defined(HT_THREAD_IMPL_WIN32)
    CloseHandle(th->th);
#endif

    ht_free(th);
}